

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

bool __thiscall
kj::ArrayPtr<const_unsigned_char>::operator<
          (ArrayPtr<const_unsigned_char> *this,ArrayPtr<const_unsigned_char> *other)

{
  int iVar1;
  WiderType<Decay<const_unsigned_long_&>,_Decay<const_unsigned_long_&>_> __n;
  int ret;
  size_t comparisonSize;
  ArrayPtr<const_unsigned_char> *other_local;
  ArrayPtr<const_unsigned_char> *this_local;
  
  __n = min<unsigned_long_const&,unsigned_long_const&>(&this->size_,&other->size_);
  iVar1 = memcmp(this->ptr,other->ptr,__n);
  if (iVar1 == 0) {
    this_local._7_1_ = this->size_ < other->size_;
  }
  else {
    this_local._7_1_ = iVar1 < 0;
  }
  return this_local._7_1_;
}

Assistant:

inline constexpr bool operator<(const ArrayPtr& other) const {
    size_t comparisonSize = kj::min(size_, other.size_);
    if constexpr (isSameType<RemoveConst<T>, char>() || isSameType<RemoveConst<T>, unsigned char>()) {
#if KJ_HAS_COMPILER_FEATURE(cxx_constexpr_string_builtins)
      int ret = __builtin_memcmp(ptr, other.ptr, comparisonSize * sizeof(T));
      if (ret != 0) {
        return ret < 0;
      }
#else
      for (size_t i = 0; i < comparisonSize; ++i) {
        if (static_cast<unsigned char>(ptr[i]) != static_cast<unsigned char>(other.ptr[i])) {
          return static_cast<unsigned char>(ptr[i]) < static_cast<unsigned char>(other.ptr[i]);
        }
      }
#endif
    } else {
      for (size_t i = 0; i < comparisonSize; i++) {
        bool ret = ptr[i] == other.ptr[i];
        if (!ret) {
          return ptr[i] < other.ptr[i];
        }
      }
    }
    // arrays are equal up to comparisonSize
    return size_ < other.size_;
  }